

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsq2psf.cpp
# Opt level: O3

bool build_choroq_psf(char *psf_path,uint8_t *tsq,size_t tsq_size,uint8_t *tvb,size_t tvb_size,
                     bool write_driver,char *driver_psflib_path,bool write_param,int song_index,
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     tags)

{
  uint8_t *puVar1;
  uint32_t initial_pc;
  size_t __n;
  size_t sVar2;
  bool bVar3;
  int iVar4;
  void *__s;
  PSFFile *pPVar5;
  ssize_t sVar6;
  char *__nbytes;
  uint uVar7;
  undefined7 in_register_00000089;
  uint load_address;
  uint uVar8;
  allocator local_8ad;
  uint32_t local_8ac;
  void *local_8a8;
  char *local_8a0;
  uint32_t local_898;
  undefined4 local_894;
  uint8_t *local_890;
  size_t local_888;
  char *local_880;
  uint8_t *local_878;
  size_t local_870;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_868;
  uint8_t psx_exe_header [2048];
  
  local_894 = (undefined4)CONCAT71(in_register_00000089,write_driver);
  __nbytes = (char *)tvb;
  local_878 = tsq;
  local_870 = tsq_size;
  __s = operator_new__(0x200000);
  memset(__s,0,0x200000);
  std::__cxx11::string::string((string *)psx_exe_header,driver_psflib_path,&local_8ad);
  pPVar5 = PSFFile::load((string *)psx_exe_header);
  if ((uint8_t *)psx_exe_header._0_8_ != psx_exe_header + 0x10) {
    operator_delete((void *)psx_exe_header._0_8_,
                    CONCAT44(psx_exe_header._20_4_,psx_exe_header._16_4_) + 1);
  }
  if (pPVar5 == (PSFFile *)0x0) {
    bVar3 = false;
    fprintf(_stderr,"Error: Unable to read \"%s\"\n",driver_psflib_path);
    goto LAB_00104c2f;
  }
  if (pPVar5->version != '\x01') {
    build_choroq_psf();
    return false;
  }
  sVar6 = ZlibReader::read(&pPVar5->compressed_exe,(int)psx_exe_header,(void *)0x800,
                           (size_t)__nbytes);
  if ((int)sVar6 == 0x800) {
    local_890 = tvb;
    local_888 = tvb_size;
    local_880 = psf_path;
    if (psx_exe_header._0_8_ == 0x45584520582d5350) {
      if ((psx_exe_header._24_4_ & 0xffffff) + psx_exe_header._28_4_ < 0x200000) {
        puVar1 = psx_exe_header + 0x4c;
        local_8ac._0_1_ = psx_exe_header[0x10];
        local_8ac._1_1_ = psx_exe_header[0x11];
        local_8ac._2_1_ = psx_exe_header[0x12];
        local_8ac._3_1_ = psx_exe_header[0x13];
        local_898._0_1_ = psx_exe_header[0x30];
        local_898._1_1_ = psx_exe_header[0x31];
        local_898._2_1_ = psx_exe_header[0x32];
        local_898._3_1_ = psx_exe_header[0x33];
        local_8a8 = __s;
        iVar4 = bcmp(puVar1,"Sony Computer Entertainment Inc. for Japan area",0x30);
        if (iVar4 == 0) {
          local_8a0 = "Japan";
        }
        else {
          iVar4 = bcmp(puVar1,"Sony Computer Entertainment Inc. for North America area",0x38);
          __nbytes = "North America";
          local_8a0 = "North America";
          if (iVar4 != 0) {
            iVar4 = bcmp(puVar1,"Sony Computer Entertainment Inc. for Europe area",0x31);
            if (iVar4 == 0) {
              local_8a0 = "Europe";
            }
            else {
              fprintf(_stderr,"Warning: Unknown region name \"%s\"\n",driver_psflib_path);
            }
          }
        }
        __s = local_8a8;
        if ((char)local_894 == '\0') {
          load_address = 0x80200000;
          uVar8 = 0x80000000;
        }
        else {
          sVar6 = ZlibReader::read(&pPVar5->compressed_exe,
                                   (psx_exe_header._24_4_ & 0xffffff) + (int)local_8a8,
                                   (void *)(ulong)(uint)psx_exe_header._28_4_,(size_t)__nbytes);
          if ((int)sVar6 != psx_exe_header._28_4_) {
            build_choroq_psf();
            goto LAB_00104cb0;
          }
          load_address = 0x80200000;
          if ((uint)psx_exe_header._24_4_ < 0x80200000) {
            load_address = psx_exe_header._24_4_;
          }
          uVar8 = 0x80000000;
          if (0x80000000 < (uint)(psx_exe_header._28_4_ + psx_exe_header._24_4_)) {
            uVar8 = psx_exe_header._28_4_ + psx_exe_header._24_4_;
          }
        }
        (*pPVar5->_vptr_PSFFile[1])(pPVar5);
        sVar2 = local_870;
        __n = local_888;
        puVar1 = local_890;
        uVar7 = uVar8;
        if (local_870 != 0 && local_878 != (uint8_t *)0x0) {
          memcpy((void *)((long)__s + 0xf0000),local_878,local_870);
          if (0x800effff < load_address) {
            load_address = 0x800f0000;
          }
          uVar7 = (int)sVar2 + 0x800f0000;
          if (uVar7 < uVar8) {
            uVar7 = uVar8;
          }
        }
        uVar8 = uVar7;
        if (__n != 0 && puVar1 != (uint8_t *)0x0) {
          memcpy((void *)((long)__s + 0x1d800),puVar1,__n);
          if (0x8001d7ff < load_address) {
            load_address = 0x8001d800;
          }
          uVar8 = (int)__n + 0x8001d800;
          if (uVar8 < uVar7) {
            uVar8 = uVar7;
          }
        }
        initial_pc = local_8ac;
        uVar7 = uVar8;
        if (write_param) {
          *(char *)((long)__s + 0xef800) = (char)song_index;
          if (0x800ef7ff < load_address) {
            load_address = 0x800ef800;
          }
          uVar7 = 0x800ef808;
          if (0x800ef808 < uVar8) {
            uVar7 = uVar8;
          }
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::_Rb_tree(&local_868,
                   (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)tags._M_t._M_impl._0_8_);
        bVar3 = save_psf1(local_880,(uint8_t *)((long)__s + (ulong)(load_address & 0xffffff)),
                          load_address,(ulong)(uVar7 - load_address),initial_pc,local_898,local_8a0,
                          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&local_868);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree(&local_868);
        goto LAB_00104c2f;
      }
    }
    build_choroq_psf();
  }
  else {
    build_choroq_psf();
  }
LAB_00104cb0:
  bVar3 = false;
LAB_00104c2f:
  operator_delete__(__s);
  return bVar3;
}

Assistant:

bool build_choroq_psf(const char * psf_path, const uint8_t * tsq, size_t tsq_size, const uint8_t * tvb, size_t tvb_size, bool write_driver, const char * driver_psflib_path, bool write_param, int song_index, std::map<std::string, std::string> tags)
{
	uint8_t * mem = new uint8_t[PSX_MEMORY_SIZE];
	if (mem == NULL) {
		fprintf(stderr, "Error: Memory allocation error\n");
		return false;
	}
	memset(mem, 0, PSX_MEMORY_SIZE);

	uint32_t load_address = 0x80000000 | PSX_MEMORY_SIZE;
	uint32_t load_end_address = 0x80000000 | 0;

	PSFFile * driver_psflib = PSFFile::load(driver_psflib_path);
	if (driver_psflib == NULL) {
		fprintf(stderr, "Error: Unable to read \"%s\"\n", driver_psflib_path);
		delete[] mem;
		return false;
	}

	if (driver_psflib->version != PSF1_PSF_VERSION) {
		fprintf(stderr, "Error: Invalid PSF version \"%s\"\n", driver_psflib_path);
		delete driver_psflib;
		delete[] mem;
		return false;
	}

	uint8_t psx_exe_header[PSF1_EXE_HEADER_SIZE];
	if (driver_psflib->compressed_exe.read(psx_exe_header, PSF1_EXE_HEADER_SIZE) != PSF1_EXE_HEADER_SIZE) {
		fprintf(stderr, "Error: Unable to read PS-X EXE header \"%s\"\n", driver_psflib_path);
		delete driver_psflib;
		delete[] mem;
		return false;
	}

	uint32_t driver_load_address = readInt(&psx_exe_header[0x18]);
	uint32_t driver_load_size = readInt(&psx_exe_header[0x1c]);
	uint32_t initial_pc = readInt(&psx_exe_header[0x10]);
	uint32_t initial_sp = readInt(&psx_exe_header[0x30]);

	if (memcmp(psx_exe_header, "PS-X EXE", 8) != 0 || (driver_load_address & PSX_MEMORY_MASK) + driver_load_size >= PSX_MEMORY_SIZE) {
		fprintf(stderr, "Error: Invalid PS-X EXE header \"%s\"\n", driver_psflib_path);
		delete driver_psflib;
		delete[] mem;
		return false;
	}

	const char * region_name;
	if (strcmp((const char *)&psx_exe_header[0x4c], "Sony Computer Entertainment Inc. for Japan area") == 0) {
		region_name = "Japan";
	}
	else if (strcmp((const char *)&psx_exe_header[0x4c], "Sony Computer Entertainment Inc. for North America area") == 0) {
		region_name = "North America";
	}
	else if (strcmp((const char *)&psx_exe_header[0x4c], "Sony Computer Entertainment Inc. for Europe area") == 0) {
		region_name = "Europe";
	}
	else {
		fprintf(stderr, "Warning: Unknown region name \"%s\"\n", driver_psflib_path);
		region_name = "North America";
	}

	if (write_driver) {
		if (driver_psflib->compressed_exe.read(&mem[driver_load_address & PSX_MEMORY_MASK], driver_load_size) != driver_load_size) {
			fprintf(stderr, "Error: Unable to read driver block \"%s\"\n", driver_psflib_path);
			delete driver_psflib;
			delete[] mem;
			return false;
		}

		load_address = std::min<uint32_t>(load_address, driver_load_address);
		load_end_address = std::max<uint32_t>(load_end_address, driver_load_address + driver_load_size);
	}
	delete driver_psflib;

	if (tsq != NULL && tsq_size != 0) {
		memcpy(&mem[MY_SEQ & PSX_MEMORY_MASK], tsq, tsq_size);
		load_address = std::min<uint32_t>(load_address, MY_SEQ);
		load_end_address = std::max<uint32_t>(load_end_address, MY_SEQ + tsq_size);
	}

	if (tvb != NULL && tvb_size != 0) {
		memcpy(&mem[MY_INSTR & PSX_MEMORY_MASK], tvb, tvb_size);
		load_address = std::min<uint32_t>(load_address, MY_INSTR);
		load_end_address = std::max<uint32_t>(load_end_address, MY_INSTR + tvb_size);
	}

	if (write_param) {
		writeByte(&mem[MPARAM_SONGINDEX & PSX_MEMORY_MASK], song_index);
		load_address = std::min<uint32_t>(load_address, MINIPSF_PARAM);
		load_end_address = std::max<uint32_t>(load_end_address, MINIPSF_PARAM + 8);
	}

	uint32_t rom_size = load_end_address - load_address;

	if (!save_psf1(psf_path, &mem[load_address & PSX_MEMORY_MASK], load_address, rom_size, initial_pc, initial_sp, region_name, tags)) {
		delete[] mem;
		return false;
	}

	delete[] mem;
	return true;
}